

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::PrintCommandTrace
          (cmMakefile *this,cmListFileFunction *lff,cmListFileBacktrace *bt,
          CommandMissingFromStack missing)

{
  TraceFormat TVar1;
  cmake *pcVar2;
  string *psVar3;
  element_type *peVar4;
  pointer pcVar5;
  double value;
  pointer pbVar6;
  _Alloc_hider _Var7;
  int iVar8;
  long lVar9;
  cmListFileContext *pcVar10;
  Value *pVVar11;
  cmake *pcVar12;
  ostream *poVar13;
  Value *root;
  string *arg_1;
  String *pSVar14;
  pointer pbVar15;
  char *pcVar16;
  const_iterator __begin2;
  string *filename;
  pointer __x;
  string *arg_2;
  cmListFileArgument *arg;
  pointer pcVar17;
  bool bVar18;
  ValueHolder local_2d8;
  long local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  cmMakefile *local_2b0;
  CommandMissingFromStack local_2a4;
  String *local_2a0;
  cmListFileContext *local_298;
  StreamWriterBuilder builder;
  Value val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string temp;
  String local_1e8;
  string local_1c8;
  ostringstream msg;
  size_t local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  local_2b0 = this;
  local_2a4 = missing;
  local_298 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                        (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  pSVar14 = &local_298->FilePath;
  cmsys::SystemTools::GetFilenameName(&local_1c8,pSVar14);
  filename = (pcVar2->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (pcVar2->TraceOnlyThisSources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2a0 = pSVar14;
  if (filename != psVar3) {
    do {
      lVar9 = std::__cxx11::string::rfind
                        ((char *)pSVar14,(ulong)(filename->_M_dataplus)._M_p,0xffffffffffffffff);
      if ((lVar9 != -1) &&
         (lVar9 + filename->_M_string_length == (local_298->FilePath)._M_string_length)) {
        cmsys::SystemTools::GetFilenameName((string *)&msg,filename);
        _Var7._M_p = _msg;
        if (local_1c8._M_string_length == local_1a0) {
          if (local_1c8._M_string_length == 0) {
            bVar18 = true;
          }
          else {
            iVar8 = bcmp(local_1c8._M_dataplus._M_p,_msg,local_1c8._M_string_length);
            bVar18 = iVar8 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var7._M_p != local_198) {
          operator_delete(_Var7._M_p,local_198[0]._M_allocated_capacity + 1);
        }
        pSVar14 = local_2a0;
        if (bVar18) goto LAB_00220287;
      }
      filename = filename + 1;
    } while (filename != psVar3);
    goto LAB_00220977;
  }
LAB_00220287:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  peVar4 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  bVar18 = local_2b0->GlobalGenerator->CMakeInstance->TraceExpand;
  root = (Value *)((long)*(pointer *)
                          ((long)&(peVar4->Arguments).
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   (long)(peVar4->Arguments).
                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&args,(long)root * -0x5555555555555555);
  peVar4 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar17 = (peVar4->Arguments).
            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar5 = *(pointer *)
            ((long)&(peVar4->Arguments).
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pcVar17 != pcVar5) {
    do {
      __x = pcVar17;
      if ((bVar18 != false) && (pcVar17->Delim != Bracket)) {
        std::__cxx11::string::_M_assign((string *)&temp);
        root = (Value *)0x0;
        ExpandVariablesInString(local_2b0,&temp,false,false,false,(char *)0x0,-1,false,false);
        __x = (pointer)&temp;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args,&__x->Value);
      pcVar17 = pcVar17 + 1;
    } while (pcVar17 != pcVar5);
  }
  pcVar10 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                      (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  TVar1 = local_2b0->GlobalGenerator->CMakeInstance->TraceFormatVar;
  if (TVar1 == TRACE_UNDEFINED) {
    lVar9 = 0x2f;
    pcVar16 = "INTERNAL ERROR: Trace format is TRACE_UNDEFINED";
LAB_0022086a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,pcVar16,lVar9);
  }
  else {
    if (TVar1 == TRACE_HUMAN) {
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&msg,(local_298->FilePath)._M_dataplus._M_p,
                           (local_298->FilePath)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"(",1);
      poVar13 = std::ostream::_M_insert<long>((long)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"):",2);
      if ((pcVar10->DeferId).
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,"DEFERRED:",9);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&msg,
                             (pcVar10->DeferId).
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_dataplus._M_p,
                             (pcVar10->DeferId).
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,":",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,"  ",2);
      peVar4 = (lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&msg,(peVar4->OriginalName)._M_dataplus._M_p,
                           (peVar4->OriginalName)._M_string_length);
      lVar9 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"(",1);
      pbVar6 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar16 = ")";
      if (args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar15 = args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&msg,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != pbVar6);
        lVar9 = 1;
      }
      goto LAB_0022086a;
    }
    if (TVar1 == TRACE_JSON_V1) {
      Json::Value::Value(&val,nullValue);
      Json::StreamWriterBuilder::StreamWriterBuilder(&builder);
      pSVar14 = local_2a0;
      Json::Value::Value((Value *)&local_2d8,"");
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"indentation","");
      pVVar11 = Json::StreamWriterBuilder::operator[](&builder,&local_1e8);
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      Json::Value::~Value((Value *)&local_2d8);
      Json::Value::Value((Value *)&local_2d8,pSVar14);
      pVVar11 = Json::Value::operator[](&val,"file");
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      Json::Value::~Value((Value *)&local_2d8);
      Json::Value::Value((Value *)&local_2d8,
                         ((lff->Impl).
                          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->Line);
      pVVar11 = Json::Value::operator[](&val,"line");
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      Json::Value::~Value((Value *)&local_2d8);
      peVar4 = (lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar9 = peVar4->LineEnd;
      if (peVar4->Line != lVar9) {
        Json::Value::Value((Value *)&local_2d8,lVar9);
        pVVar11 = Json::Value::operator[](&val,"line_end");
        Json::Value::operator=(pVVar11,(Value *)&local_2d8);
        Json::Value::~Value((Value *)&local_2d8);
      }
      if ((pcVar10->DeferId).
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        Json::Value::Value((Value *)&local_2d8,(String *)&pcVar10->DeferId);
        pVVar11 = Json::Value::operator[](&val,"defer");
        Json::Value::operator=(pVVar11,(Value *)&local_2d8);
        Json::Value::~Value((Value *)&local_2d8);
      }
      Json::Value::Value((Value *)&local_2d8,
                         &((lff->Impl).
                           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->OriginalName);
      pVVar11 = Json::Value::operator[](&val,"cmd");
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      Json::Value::~Value((Value *)&local_2d8);
      Json::Value::Value((Value *)&local_2d8,arrayValue);
      pVVar11 = Json::Value::operator[](&val,"args");
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      Json::Value::~Value((Value *)&local_2d8);
      pbVar6 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar15 = args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pVVar11 = Json::Value::operator[](&val,"args");
          Json::Value::Value((Value *)&local_2d8,pbVar15);
          Json::Value::append(pVVar11,(Value *)&local_2d8);
          Json::Value::~Value((Value *)&local_2d8);
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != pbVar6);
      }
      value = cmsys::SystemTools::GetTime();
      Json::Value::Value((Value *)&local_2d8,value);
      pVVar11 = Json::Value::operator[](&val,"time");
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      Json::Value::~Value((Value *)&local_2d8);
      bVar18 = local_2a4 == Yes;
      Json::Value::Value((Value *)&local_2d8,
                         ((long)(local_2b0->ExecutionStatusStack).
                                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_2b0->ExecutionStatusStack).
                                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) + (ulong)bVar18);
      pVVar11 = Json::Value::operator[](&val,"frame");
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      Json::Value::~Value((Value *)&local_2d8);
      Json::Value::Value((Value *)&local_2d8,(long)local_2b0->RecursionDepth + (ulong)bVar18);
      pVVar11 = Json::Value::operator[](&val,"global_frame");
      Json::Value::operator=(pVVar11,(Value *)&local_2d8);
      Json::Value::~Value((Value *)&local_2d8);
      Json::writeString_abi_cxx11_((String *)&local_2d8,(Json *)&builder,(Factory *)&val,root);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&msg,local_2d8.string_,local_2d0);
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8.string_,local_2c8._M_allocated_capacity + 1);
      }
      Json::StreamWriterBuilder::~StreamWriterBuilder(&builder);
      Json::Value::~Value(&val);
    }
  }
  pcVar2 = local_2b0->GlobalGenerator->CMakeInstance;
  do {
    pcVar12 = pcVar2;
    pcVar2 = pcVar12->TraceRedirect;
  } while (pcVar12->TraceRedirect != (cmake *)0x0);
  if (((byte)((pcVar12->TraceFile).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
              ._vptr_basic_ostream[-3] + 0x20)
             [(long)&(pcVar12->TraceFile).super_ofstream.
                     super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream] & 5) ==
      0) {
    std::__cxx11::stringbuf::str();
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pcVar12->TraceFile,(char *)builder.super_Factory._vptr_Factory,
                         builder.settings_.value_.int_);
    val.value_.bool_ = true;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&val,1);
  }
  else {
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)&builder,(char *)0x0);
  }
  if ((anon_struct_4_2_14fb5ae2_for_bits_ *)builder.super_Factory._vptr_Factory !=
      &builder.settings_.bits_) {
    operator_delete(builder.super_Factory._vptr_Factory,builder.settings_._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)temp._M_dataplus._M_p != &temp.field_2) {
    operator_delete(temp._M_dataplus._M_p,
                    CONCAT71(temp.field_2._M_allocated_capacity._1_7_,temp.field_2._M_local_buf[0])
                    + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  std::ios_base::~ios_base(local_138);
LAB_00220977:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(cmListFileFunction const& lff,
                                   cmListFileBacktrace const& bt,
                                   CommandMissingFromStack missing) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = bt.Top().FilePath;
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::string const& file : trace_only_this_files) {
      std::string::size_type const pos = full_path.rfind(file);
      trace = (pos != std::string::npos) &&
        ((pos + file.size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(file));
      if (trace) {
        break;
      }
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  std::vector<std::string> args;
  std::string temp;
  bool expand = this->GetCMakeInstance()->GetTraceExpand();

  args.reserve(lff.Arguments().size());
  for (cmListFileArgument const& arg : lff.Arguments()) {
    if (expand && arg.Delim != cmListFileArgument::Bracket) {
      temp = arg.Value;
      this->ExpandVariablesInString(temp);
      args.push_back(temp);
    } else {
      args.push_back(arg.Value);
    }
  }
  cm::optional<std::string> const& deferId = bt.Top().DeferId;

  switch (this->GetCMakeInstance()->GetTraceFormat()) {
    case cmake::TraceFormat::TRACE_JSON_V1: {
#ifndef CMAKE_BOOTSTRAP
      Json::Value val;
      Json::StreamWriterBuilder builder;
      builder["indentation"] = "";
      val["file"] = full_path;
      val["line"] = static_cast<Json::Value::Int64>(lff.Line());
      if (lff.Line() != lff.LineEnd()) {
        val["line_end"] = static_cast<Json::Value::Int64>(lff.LineEnd());
      }
      if (deferId) {
        val["defer"] = *deferId;
      }
      val["cmd"] = lff.OriginalName();
      val["args"] = Json::Value(Json::arrayValue);
      for (std::string const& arg : args) {
        val["args"].append(arg);
      }
      val["time"] = cmSystemTools::GetTime();
      val["frame"] = (missing == CommandMissingFromStack::Yes ? 1 : 0) +
        static_cast<Json::Value::UInt64>(this->ExecutionStatusStack.size());
      val["global_frame"] = (missing == CommandMissingFromStack::Yes ? 1 : 0) +
        static_cast<Json::Value::UInt64>(this->RecursionDepth);
      msg << Json::writeString(builder, val);
#endif
      break;
    }
    case cmake::TraceFormat::TRACE_HUMAN:
      msg << full_path << "(" << lff.Line() << "):";
      if (deferId) {
        msg << "DEFERRED:" << *deferId << ":";
      }
      msg << "  " << lff.OriginalName() << "(";

      for (std::string const& arg : args) {
        msg << arg << " ";
      }
      msg << ")";
      break;
    case cmake::TraceFormat::TRACE_UNDEFINED:
      msg << "INTERNAL ERROR: Trace format is TRACE_UNDEFINED";
      break;
  }

  auto& f = this->GetCMakeInstance()->GetTraceFile();
  if (f) {
    f << msg.str() << '\n';
  } else {
    cmSystemTools::Message(msg.str());
  }
}